

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::Detail::Approx::equalityComparisonImpl(Approx *this,double other)

{
  double lhs;
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  double local_50;
  bool local_19;
  double other_local;
  Approx *this_local;
  
  bVar3 = anon_unknown.dwarf_e50d5::marginComparison(this->m_value,other,this->m_margin);
  local_19 = true;
  if (!bVar3) {
    lhs = this->m_value;
    dVar1 = this->m_epsilon;
    dVar2 = this->m_scale;
    uVar4 = clara::std::isinf(this->m_value);
    if ((uVar4 & 1) == 0) {
      local_50 = this->m_value;
    }
    else {
      local_50 = 0.0;
    }
    local_19 = anon_unknown.dwarf_e50d5::marginComparison(lhs,other,dVar1 * (dVar2 + ABS(local_50)))
    ;
  }
  return local_19;
}

Assistant:

bool Approx::equalityComparisonImpl(const double other) const {
        // First try with fixed margin, then compute margin based on epsilon, scale and Approx's value
        // Thanks to Richard Harris for his help refining the scaled margin value
        return marginComparison(m_value, other, m_margin)
            || marginComparison(m_value, other, m_epsilon * (m_scale + std::fabs(std::isinf(m_value)? 0 : m_value)));
    }